

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseBitwiseOr(StructuralParser *this)

{
  bool bVar1;
  Expression *a;
  Expression *b;
  Context context;
  
  a = parseBitwiseXor(this);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x2a352b);
    if (!bVar1) break;
    getContext(&context,this);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    b = parseBitwiseXor(this);
    a = createBinaryOperator(this,&context,a,b,bitwiseOr);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&context);
  }
  return a;
}

Assistant:

AST::Expression& parseBitwiseOr()
    {
        for (pool_ref<AST::Expression> a = parseBitwiseXor();;)
        {
            if (! matches (Operator::bitwiseOr))
                return a;

            auto context = getContext();
            skip();
            a = createBinaryOperator (context, a, parseBitwiseXor(), BinaryOp::Op::bitwiseOr);
        }
    }